

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void makePreviewImage(Array2D<Imf_3_4::Rgba> *pixels,int width,int height,
                     Array2D<Imf_3_4::PreviewRgba> *previewPixels,int *previewWidth,
                     int *previewHeight)

{
  Rgba *pRVar1;
  PreviewRgba *pPVar2;
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  long lVar3;
  long lVar4;
  int x;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  long local_60;
  long local_58;
  
  *previewWidth = width / 8;
  *previewHeight = height / 8;
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::resizeErase
            (previewPixels,(long)(height / 8),(long)*previewWidth);
  local_58 = 0;
  local_60 = 0;
  for (lVar3 = 0; lVar3 < *previewHeight; lVar3 = lVar3 + 1) {
    lVar6 = 4;
    for (lVar5 = 0; lVar5 < *previewWidth; lVar5 = lVar5 + 1) {
      lVar7 = pixels->_sizeY * local_58;
      pRVar1 = pixels->_data;
      lVar4 = previewPixels->_sizeY * local_60;
      pPVar2 = previewPixels->_data;
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)pRVar1 + lVar6 + -4 + lVar7) * 4));
      (&pPVar2[lVar5].r)[lVar4] = extraout_AL;
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)pRVar1 + lVar6 + -2 + lVar7) * 4));
      (&pPVar2[lVar5].g)[lVar4] = extraout_AL_00;
      gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)((long)&(pRVar1->r)._h + lVar6 + lVar7) * 4));
      (&pPVar2[lVar5].b)[lVar4] = extraout_AL_01;
      fVar8 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)&(pRVar1->g)._h + lVar6 + lVar7) * 4) * 255.0;
      fVar9 = 255.0;
      if (fVar8 <= 255.0) {
        fVar9 = fVar8;
      }
      (&pPVar2[lVar5].a)[lVar4] =
           (uchar)(int)(float)(-(uint)(fVar8 < 0.0) & 0x3f000000 |
                              ~-(uint)(fVar8 < 0.0) & (uint)(fVar9 + 0.5));
      lVar6 = lVar6 + 0x40;
    }
    local_60 = local_60 + 4;
    local_58 = local_58 + 0x40;
  }
  return;
}

Assistant:

void
makePreviewImage (
    const Array2D<Rgba>&  pixels,
    int                   width,
    int                   height,
    Array2D<PreviewRgba>& previewPixels,
    int&                  previewWidth,
    int&                  previewHeight)
{
    const int N = 8;

    previewWidth  = width / N;
    previewHeight = height / N;
    previewPixels.resizeErase (previewHeight, previewWidth);

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {
            const Rgba&  inPixel  = pixels[y * N][x * N];
            PreviewRgba& outPixel = previewPixels[y][x];

            outPixel.r = gamma (inPixel.r);
            outPixel.g = gamma (inPixel.g);
            outPixel.b = gamma (inPixel.b);
            outPixel.a = int (
                IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) + 0.5f);
        }
    }
}